

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_node.cc
# Opt level: O1

RC __thiscall QL_Node::CheckConditions(QL_Node *this,char *recData)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  Cond *pCVar6;
  char cVar7;
  char *__s;
  void *__s_00;
  char *pcVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  
  if (this->condIndex < 1) {
    return 0;
  }
  lVar10 = 0x2c;
  lVar9 = 0;
  do {
    pCVar6 = this->condList;
    iVar1 = *(int *)((long)pCVar6 + lVar10 + -0x2c);
    iVar2 = *(int *)((long)&pCVar6->offset1 + lVar10);
    if (*(char *)((long)pCVar6 + lVar10 + -0x1c) == '\0') {
      if (iVar2 != 2) {
LAB_001134de:
        pcVar8 = recData + *(int *)((long)pCVar6 + lVar10 + -0xc);
        goto LAB_001134e9;
      }
      iVar3 = *(int *)((long)pCVar6 + lVar10 + -8);
      iVar4 = *(int *)((long)pCVar6 + lVar10 + -4);
      if (iVar3 == iVar4) goto LAB_001134de;
      iVar2 = *(int *)((long)pCVar6 + lVar10 + -0xc);
      if (iVar4 <= iVar3) {
        pcVar8 = (char *)malloc((long)iVar4 + 1);
        memset(pcVar8,0,(long)*(int *)((long)pCVar6 + lVar10 + -4) + 1);
        pcVar11 = recData + iVar2;
LAB_0011364c:
        memcpy(pcVar8,pcVar11,(long)*(int *)((long)pCVar6 + lVar10 + -4));
        pcVar8[*(int *)((long)pCVar6 + lVar10 + -4)] = '\0';
        __s = recData + iVar1;
        iVar1 = *(int *)((long)pCVar6 + lVar10 + -4);
        uVar5 = *(undefined4 *)((long)&pCVar6->offset1 + lVar10);
        pcVar11 = pcVar8;
        goto LAB_0011367a;
      }
      __s_00 = malloc((long)iVar3 + 1);
      memset(__s_00,0,(long)*(int *)((long)pCVar6 + lVar10 + -8) + 1);
      memcpy(__s_00,recData + iVar1,(long)*(int *)((long)pCVar6 + lVar10 + -8));
      *(undefined1 *)((long)__s_00 + (long)*(int *)((long)pCVar6 + lVar10 + -8)) = 0;
      cVar7 = (**(code **)((long)pCVar6 + lVar10 + -0x24))
                        (__s_00,recData + iVar2,*(undefined4 *)((long)&pCVar6->offset1 + lVar10),
                         *(int *)((long)pCVar6 + lVar10 + -8) + 1);
      free(__s_00);
    }
    else {
      if (iVar2 == 2) {
        iVar3 = *(int *)((long)pCVar6 + lVar10 + -8);
        iVar4 = *(int *)((long)pCVar6 + lVar10 + -4);
        if (iVar3 != iVar4) {
          if (iVar4 <= iVar3) {
            pcVar8 = (char *)malloc((long)iVar4 + 1);
            memset(pcVar8,0,(long)*(int *)((long)pCVar6 + lVar10 + -4) + 1);
            pcVar11 = *(char **)((long)pCVar6 + lVar10 + -0x14);
            goto LAB_0011364c;
          }
          __s = (char *)malloc((long)iVar3 + 1);
          memset(__s,0,(long)*(int *)((long)pCVar6 + lVar10 + -8) + 1);
          memcpy(__s,recData + iVar1,(long)*(int *)((long)pCVar6 + lVar10 + -8));
          __s[*(int *)((long)pCVar6 + lVar10 + -8)] = '\0';
          pcVar8 = *(char **)((long)pCVar6 + lVar10 + -0x14);
          uVar5 = *(undefined4 *)((long)&pCVar6->offset1 + lVar10);
          iVar1 = *(int *)((long)pCVar6 + lVar10 + -8);
          pcVar11 = __s;
LAB_0011367a:
          cVar7 = (**(code **)((long)pCVar6 + lVar10 + -0x24))(__s,pcVar8,uVar5,iVar1 + 1);
          free(pcVar11);
          goto joined_r0x00113692;
        }
      }
      pcVar8 = *(char **)((long)pCVar6 + lVar10 + -0x14);
LAB_001134e9:
      cVar7 = (**(code **)((long)pCVar6 + lVar10 + -0x24))
                        (recData + iVar1,pcVar8,iVar2,*(undefined4 *)((long)pCVar6 + lVar10 + -8));
    }
joined_r0x00113692:
    if (cVar7 == '\0') {
      return 0x197;
    }
    lVar9 = lVar9 + 1;
    lVar10 = lVar10 + 0x30;
    if (this->condIndex <= lVar9) {
      return 0;
    }
  } while( true );
}

Assistant:

RC QL_Node::CheckConditions(char *recData){
  RC rc = 0;
  for(int i = 0; i < condIndex; i++){
    int offset1 = condList[i].offset1;
    // If we are comparing this to a value
    if(! condList[i].isValue){
      // If it's not a string, or string of equal length, just compare
      if(condList[i].type != STRING || condList[i].length == condList[i].length2){
        int offset2 = condList[i].offset2;
        bool comp = condList[i].comparator((void *)(recData + offset1), (void *)(recData + offset2), 
          condList[i].type, condList[i].length);

        if(comp == false){
          return (QL_CONDNOTMET);
        }
      }
      // Depending on if the value or attribute is shorter, null terminate the shorter one and compare
      else if(condList[i].length < condList[i].length2){
        int offset2 = condList[i].offset2;
        char *shorter = (char*)malloc(condList[i].length + 1);
        memset((void *)shorter, 0, condList[i].length + 1);
        memcpy(shorter, recData + offset1, condList[i].length);
        shorter[condList[i].length] = '\0';
        bool comp = condList[i].comparator(shorter, (void*)(recData + offset2), condList[i].type, condList[i].length + 1);
        free(shorter);
        if(comp == false)
          return (QL_CONDNOTMET);
      }
      else{
        int offset2 = condList[i].offset2;
        char *shorter = (char*)malloc(condList[i].length2 + 1);
        memset((void*)shorter, 0, condList[i].length2 + 1);
        memcpy(shorter, recData + offset2, condList[i].length2);
        shorter[condList[i].length2] = '\0';
        bool comp = condList[i].comparator((void*)(recData + offset1), shorter, condList[i].type, condList[i].length2 +1);
        free(shorter);
        if(comp == false)
          return (QL_CONDNOTMET);
      }
    }
    // Else, we are comparing it to another attribute
    else{
      // If it's not a string, or string of equal length, just compare
      if(condList[i].type != STRING || condList[i].length == condList[i].length2){
        bool comp = condList[i].comparator((void *)(recData + offset1), condList[i].data, 
          condList[i].type, condList[i].length);

        if(comp == false)
          return (QL_CONDNOTMET);
      }
      // Depending on which one is shorter, null terminate the shorter one and compare
      else if(condList[i].length < condList[i].length2){
        char *shorter = (char*)malloc(condList[i].length + 1);
        memset((void *)shorter, 0, condList[i].length + 1);
        memcpy(shorter, recData + offset1, condList[i].length);
        shorter[condList[i].length] = '\0';
        bool comp = condList[i].comparator(shorter, condList[i].data, condList[i].type, condList[i].length + 1);
        free(shorter);
        if(comp == false)
          return (QL_CONDNOTMET);
      }
      else{
        char *shorter = (char*)malloc(condList[i].length2 + 1);
        memset((void*)shorter, 0, condList[i].length2 + 1);
        memcpy(shorter, condList[i].data, condList[i].length2);
        shorter[condList[i].length2] = '\0';
        bool comp = condList[i].comparator((void*)(recData + offset1), shorter, condList[i].type, condList[i].length2 +1);
        free(shorter);
        if(comp == false)
          return (QL_CONDNOTMET);
      }
    }
  }

  return (0);
}